

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey0,secp256k1_pubkey *pubkey1)

{
  int iVar1;
  long lVar2;
  uchar (*output) [33];
  size_t out_size;
  secp256k1_pubkey *pk [2];
  uchar out [2] [33];
  
  if (ctx != (secp256k1_context *)0x0) {
    pk[0] = pubkey0;
    pk[1] = pubkey1;
    output = out;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      out_size = 0x21;
      iVar1 = secp256k1_ec_pubkey_serialize(ctx,*output,&out_size,pk[lVar2],0x102);
      if (iVar1 == 0) {
        *(uchar *)((long)output + 0x10) = '\0';
        *(uchar *)((long)output + 0x11) = '\0';
        *(uchar *)((long)output + 0x12) = '\0';
        *(uchar *)((long)output + 0x13) = '\0';
        *(uchar *)((long)output + 0x14) = '\0';
        *(uchar *)((long)output + 0x15) = '\0';
        *(uchar *)((long)output + 0x16) = '\0';
        *(uchar *)((long)output + 0x17) = '\0';
        *(uchar *)((long)output + 0x18) = '\0';
        *(uchar *)((long)output + 0x19) = '\0';
        *(uchar *)((long)output + 0x1a) = '\0';
        *(uchar *)((long)output + 0x1b) = '\0';
        *(uchar *)((long)output + 0x1c) = '\0';
        *(uchar *)((long)output + 0x1d) = '\0';
        *(uchar *)((long)output + 0x1e) = '\0';
        *(uchar *)((long)output + 0x1f) = '\0';
        *(uchar *)((long)output + 0) = '\0';
        *(uchar *)((long)output + 1) = '\0';
        *(uchar *)((long)output + 2) = '\0';
        *(uchar *)((long)output + 3) = '\0';
        *(uchar *)((long)output + 4) = '\0';
        *(uchar *)((long)output + 5) = '\0';
        *(uchar *)((long)output + 6) = '\0';
        *(uchar *)((long)output + 7) = '\0';
        *(uchar *)((long)output + 8) = '\0';
        *(uchar *)((long)output + 9) = '\0';
        *(uchar *)((long)output + 10) = '\0';
        *(uchar *)((long)output + 0xb) = '\0';
        *(uchar *)((long)output + 0xc) = '\0';
        *(uchar *)((long)output + 0xd) = '\0';
        *(uchar *)((long)output + 0xe) = '\0';
        *(uchar *)((long)output + 0xf) = '\0';
        (*output)[0x20] = '\0';
      }
      output = output + 1;
    }
    iVar1 = secp256k1_memcmp_var(out,out + 1,0x21);
    return iVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/secp256k1.c"
          ,0x128,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ec_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_pubkey* pubkey0, const secp256k1_pubkey* pubkey1) {
    unsigned char out[2][33];
    const secp256k1_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pubkey0; pk[1] = pubkey1;
    for (i = 0; i < 2; i++) {
        size_t out_size = sizeof(out[i]);
        /* If the public key is NULL or invalid, ec_pubkey_serialize will call
         * the illegal_callback and return 0. In that case we will serialize the
         * key as all zeros which is less than any valid public key. This
         * results in consistent comparisons even if NULL or invalid pubkeys are
         * involved and prevents edge cases such as sorting algorithms that use
         * this function and do not terminate as a result. */
        if (!secp256k1_ec_pubkey_serialize(ctx, out[i], &out_size, pk[i], SECP256K1_EC_COMPRESSED)) {
            /* Note that ec_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[0]));
}